

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

void boost::detail::add_new_tss_node
               (void *key,shared_ptr<boost::detail::tss_cleanup_function> *func,void *tss_data)

{
  thread_data_base *ptVar1;
  shared_count sStack_68;
  void *local_60;
  element_type *local_58;
  shared_count local_50;
  pair<const_void_*,_boost::detail::tss_data_node> local_48;
  
  ptVar1 = get_or_make_current_thread_data();
  local_58 = func->px;
  local_50.pi_ = (func->pn).pi_;
  if (local_50.pi_ == (sp_counted_base *)0x0) {
    sStack_68.pi_ = (sp_counted_base *)0x0;
  }
  else {
    LOCK();
    (local_50.pi_)->use_count_ = (local_50.pi_)->use_count_ + 1;
    UNLOCK();
    LOCK();
    (local_50.pi_)->use_count_ = (local_50.pi_)->use_count_ + 1;
    UNLOCK();
    sStack_68.pi_ = local_50.pi_;
  }
  local_48.second.func.pn.pi_ = sStack_68.pi_;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  local_60 = tss_data;
  local_48.first = key;
  local_48.second.func.px = local_58;
  local_48.second.value = tss_data;
  std::
  _Rb_tree<void_const*,std::pair<void_const*const,boost::detail::tss_data_node>,std::_Select1st<std::pair<void_const*const,boost::detail::tss_data_node>>,std::less<void_const*>,std::allocator<std::pair<void_const*const,boost::detail::tss_data_node>>>
  ::_M_emplace_unique<std::pair<void_const*,boost::detail::tss_data_node>>
            ((_Rb_tree<void_const*,std::pair<void_const*const,boost::detail::tss_data_node>,std::_Select1st<std::pair<void_const*const,boost::detail::tss_data_node>>,std::less<void_const*>,std::allocator<std::pair<void_const*const,boost::detail::tss_data_node>>>
              *)&ptVar1->tss_data,&local_48);
  shared_count::~shared_count(&local_48.second.func.pn);
  shared_count::~shared_count(&sStack_68);
  shared_count::~shared_count(&local_50);
  return;
}

Assistant:

void add_new_tss_node(void const* key,
                              boost::shared_ptr<tss_cleanup_function> func,
                              void* tss_data)
        {
            detail::thread_data_base* const current_thread_data(get_or_make_current_thread_data());
            current_thread_data->tss_data.insert(std::make_pair(key,tss_data_node(func,tss_data)));
        }